

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConeShape.cpp
# Opt level: O1

void __thiscall cbtConeShapeZ::cbtConeShapeZ(cbtConeShapeZ *this,cbtScalar radius,cbtScalar height)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  undefined1 auVar3 [16];
  float fVar4;
  
  cbtConvexInternalShape::cbtConvexInternalShape((cbtConvexInternalShape *)this);
  (this->super_cbtConeShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape = (_func_int **)&PTR__cbtConvexShape_00b71cf8;
  (this->super_cbtConeShape).m_radius = radius;
  (this->super_cbtConeShape).m_height = height;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape.m_shapeType = 0xb;
  (this->super_cbtConeShape).m_coneIndices[0] = 0;
  (this->super_cbtConeShape).m_coneIndices[1] = 1;
  (this->super_cbtConeShape).m_coneIndices[2] = 2;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.m_floats[0] =
       radius;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.m_floats[1] =
       height;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.m_floats[2] =
       radius;
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(height * height)),ZEXT416((uint)radius),
                           ZEXT416((uint)radius));
  if (auVar3._0_4_ < 0.0) {
    fVar4 = sqrtf(auVar3._0_4_);
  }
  else {
    auVar3 = vsqrtss_avx(auVar3,auVar3);
    fVar4 = auVar3._0_4_;
  }
  *(float *)&(this->super_cbtConeShape).super_cbtConvexInternalShape.field_0x44 = radius / fVar4;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape = (_func_int **)&PTR__cbtConvexShape_00b71dd8;
  (this->super_cbtConeShape).m_coneIndices[0] = 0;
  (this->super_cbtConeShape).m_coneIndices[1] = 2;
  (this->super_cbtConeShape).m_coneIndices[2] = 1;
  cVar1 = (this->super_cbtConeShape).m_radius;
  cVar2 = (this->super_cbtConeShape).m_height;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.m_floats[0] =
       cVar1;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.m_floats[2] =
       cVar2;
  (this->super_cbtConeShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.m_floats[1] =
       cVar1;
  return;
}

Assistant:

cbtConeShapeZ::cbtConeShapeZ(cbtScalar radius, cbtScalar height) : cbtConeShape(radius, height)
{
	setConeUpIndex(2);
}